

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::replace_illegal_names
          (CompilerGLSL *this,
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *keywords)

{
  ParsedIR *this_00;
  uint uVar1;
  size_t sVar2;
  bool bVar3;
  SPIRVariable *var;
  Meta *pMVar4;
  const_iterator cVar5;
  SPIRFunction *pSVar6;
  SPIRType *pSVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  Decoration *memb;
  Decoration *__k;
  long lVar9;
  TypedID<(spirv_cross::Types)0> *id;
  TypedID<(spirv_cross::Types)0> *pTVar10;
  LoopLock loop_lock;
  LoopLock local_68;
  CompilerGLSL *local_60;
  TypedID<(spirv_cross::Types)0> *local_58;
  string local_50;
  
  this_00 = &(this->super_Compiler).ir;
  ParsedIR::create_loop_hard_lock(this_00);
  pTVar10 = (this->super_Compiler).ir.ids_for_type[2].
            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  sVar2 = (this->super_Compiler).ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  local_60 = this;
  for (lVar9 = 0; sVar2 << 2 != lVar9; lVar9 = lVar9 + 4) {
    uVar1 = *(uint *)((long)&pTVar10->id + lVar9);
    pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)uVar1 * 0x18);
    if (*(int *)((long)&pbVar8->field_2 +
                (long)(local_60->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr)
        == 2) {
      var = ParsedIR::get<spirv_cross::SPIRVariable>(this_00,uVar1);
      bVar3 = Compiler::is_hidden_variable(&local_60->super_Compiler,var,false);
      if (!bVar3) {
        pMVar4 = ParsedIR::find_meta(this_00,(ID)(var->super_IVariant).self.id);
        if (pMVar4 != (Meta *)0x0) {
          cVar5 = ::std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::find(&keywords->_M_h,(key_type *)pMVar4);
          if (cVar5.
              super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ._M_cur != (__node_type *)0x0) {
            join<char_const(&)[2],std::__cxx11::string&>
                      (&local_50,(spirv_cross *)0x3835c0,(char (*) [2])pMVar4,pbVar8);
            ::std::__cxx11::string::operator=((string *)pMVar4,(string *)&local_50);
            ::std::__cxx11::string::~string((string *)&local_50);
          }
        }
      }
    }
  }
  ParsedIR::LoopLock::~LoopLock(&local_68);
  ParsedIR::create_loop_hard_lock(this_00);
  pTVar10 = (local_60->super_Compiler).ir.ids_for_type[4].
            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  sVar2 = (local_60->super_Compiler).ir.ids_for_type[4].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  for (lVar9 = 0; sVar2 << 2 != lVar9; lVar9 = lVar9 + 4) {
    uVar1 = *(uint *)((long)&pTVar10->id + lVar9);
    pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)uVar1 * 0x18);
    if (*(int *)((long)&pbVar8->field_2 +
                (long)(local_60->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr)
        == 4) {
      pSVar6 = ParsedIR::get<spirv_cross::SPIRFunction>(this_00,uVar1);
      pMVar4 = ParsedIR::find_meta(this_00,(ID)(pSVar6->super_IVariant).self.id);
      if (pMVar4 != (Meta *)0x0) {
        cVar5 = ::std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::find(&keywords->_M_h,(key_type *)pMVar4);
        if (cVar5.
            super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ._M_cur != (__node_type *)0x0) {
          join<char_const(&)[2],std::__cxx11::string&>
                    (&local_50,(spirv_cross *)0x3835c0,(char (*) [2])pMVar4,pbVar8);
          ::std::__cxx11::string::operator=((string *)pMVar4,(string *)&local_50);
          ::std::__cxx11::string::~string((string *)&local_50);
        }
      }
    }
  }
  ParsedIR::LoopLock::~LoopLock(&local_68);
  ParsedIR::create_loop_hard_lock(this_00);
  pTVar10 = (local_60->super_Compiler).ir.ids_for_type[1].
            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  local_58 = pTVar10 + (local_60->super_Compiler).ir.ids_for_type[1].
                       super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  for (; pTVar10 != local_58; pTVar10 = pTVar10 + 1) {
    pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)pTVar10->id * 0x18);
    if (*(int *)((long)&pbVar8->field_2 +
                (long)(local_60->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr)
        == 1) {
      pSVar7 = ParsedIR::get<spirv_cross::SPIRType>(this_00,pTVar10->id);
      pMVar4 = ParsedIR::find_meta(this_00,(ID)(pSVar7->super_IVariant).self.id);
      if (pMVar4 != (Meta *)0x0) {
        cVar5 = ::std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::find(&keywords->_M_h,(key_type *)pMVar4);
        if (cVar5.
            super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ._M_cur != (__node_type *)0x0) {
          join<char_const(&)[2],std::__cxx11::string&>
                    (&local_50,(spirv_cross *)0x3835c0,(char (*) [2])pMVar4,pbVar8);
          ::std::__cxx11::string::operator=((string *)pMVar4,(string *)&local_50);
          ::std::__cxx11::string::~string((string *)&local_50);
        }
        __k = (pMVar4->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr;
        for (lVar9 = (pMVar4->members).super_VectorView<spirv_cross::Meta::Decoration>.buffer_size *
                     0x168; lVar9 != 0; lVar9 = lVar9 + -0x168) {
          cVar5 = ::std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::find(&keywords->_M_h,&__k->alias);
          if (cVar5.
              super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ._M_cur != (__node_type *)0x0) {
            join<char_const(&)[2],std::__cxx11::string&>
                      (&local_50,(spirv_cross *)0x3835c0,(char (*) [2])__k,pbVar8);
            ::std::__cxx11::string::operator=((string *)__k,(string *)&local_50);
            ::std::__cxx11::string::~string((string *)&local_50);
          }
          __k = __k + 1;
        }
      }
    }
  }
  ParsedIR::LoopLock::~LoopLock(&local_68);
  return;
}

Assistant:

void CompilerGLSL::replace_illegal_names(const unordered_set<string> &keywords)
{
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, const SPIRVariable &var) {
		if (is_hidden_variable(var))
			return;

		auto *meta = ir.find_meta(var.self);
		if (!meta)
			return;

		auto &m = meta->decoration;
		if (keywords.find(m.alias) != end(keywords))
			m.alias = join("_", m.alias);
	});

	ir.for_each_typed_id<SPIRFunction>([&](uint32_t, const SPIRFunction &func) {
		auto *meta = ir.find_meta(func.self);
		if (!meta)
			return;

		auto &m = meta->decoration;
		if (keywords.find(m.alias) != end(keywords))
			m.alias = join("_", m.alias);
	});

	ir.for_each_typed_id<SPIRType>([&](uint32_t, const SPIRType &type) {
		auto *meta = ir.find_meta(type.self);
		if (!meta)
			return;

		auto &m = meta->decoration;
		if (keywords.find(m.alias) != end(keywords))
			m.alias = join("_", m.alias);

		for (auto &memb : meta->members)
			if (keywords.find(memb.alias) != end(keywords))
				memb.alias = join("_", memb.alias);
	});
}